

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::CodePointMatcherWarehouse
          (CodePointMatcherWarehouse *this,CodePointMatcherWarehouse *src)

{
  int32_t iVar1;
  
  std::array<icu_63::numparse::impl::CodePointMatcher,_5UL>::array
            (&this->codePoints,&src->codePoints);
  MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::MaybeStackArray
            (&this->codePointsOverflow,&src->codePointsOverflow);
  iVar1 = src->codePointNumBatches;
  this->codePointCount = src->codePointCount;
  this->codePointNumBatches = iVar1;
  return;
}

Assistant:

CodePointMatcherWarehouse::CodePointMatcherWarehouse(CodePointMatcherWarehouse&& src) U_NOEXCEPT
        : codePoints(std::move(src.codePoints)),
          codePointsOverflow(std::move(src.codePointsOverflow)),
          codePointCount(src.codePointCount),
          codePointNumBatches(src.codePointNumBatches) {}